

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O1

Abc_SccCost_t Abc_TgRecordPhase(Abc_TgMan_t *pMan,int mode)

{
  ulong *puVar1;
  int *__dest;
  byte bVar2;
  Vec_Int_t *p;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  ulong *puVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  int *__src;
  uint uVar17;
  Abc_SccCost_t AVar18;
  int pMinScc [18];
  int pScc [18];
  int local_c8 [20];
  int local_78 [18];
  
  if (pMan->fPhased == 0) {
    p = pMan->vPhase;
    uVar7 = (uint)pMan->pGroup[0].nGVars;
    uVar11 = (pMan->nGVars - (uint)(mode == 0)) + 2;
    Abc_TgReorderFGrps(pMan);
    local_c8[1] = Abc_TtScc(pMan->pTruth,pMan->nVars);
    Abc_TgCalcScc(pMan,local_c8 + 2,1);
    uVar17 = 0;
    local_c8[0] = 0;
    if (mode != 0) {
      local_c8[0] = Abc_TgPermCostScc(pMan,local_c8 + 2);
    }
    Vec_IntPush(p,0);
    __src = local_78 + (mode == 0);
    __dest = local_c8 + (mode == 0);
LAB_00501e84:
    uVar17 = uVar17 + 1;
    lVar4 = 0;
    do {
      lVar9 = lVar4;
      lVar4 = lVar9 + 1;
    } while ((uVar17 >> ((uint)lVar9 & 0x1f) & 1) == 0);
    if ((int)(uint)lVar9 < (int)uVar7) {
      for (bVar5 = pMan->pFGrps[lVar9]; -1 < (char)bVar5; bVar5 = pMan->symLink[bVar5]) {
        if (pMan->symPhase[bVar5] != '\0') {
          iVar6 = pMan->nVars + -6;
          uVar13 = 1 << ((byte)iVar6 & 0x1f);
          bVar2 = pMan->pPermTRev[bVar5];
          iVar8 = (int)(char)bVar2;
          puVar12 = pMan->pTruth;
          if (pMan->nVars < 7) {
            bVar10 = (byte)(1 << (bVar2 & 0x1f));
            *puVar12 = (s_Truths6[iVar8] & *puVar12) >> (bVar10 & 0x3f) |
                       *puVar12 << (bVar10 & 0x3f) & s_Truths6[iVar8];
          }
          else if ((char)bVar2 < '\x06') {
            if (iVar6 != 0x1f) {
              uVar14 = s_Truths6[iVar8];
              uVar15 = 0;
              do {
                bVar10 = (byte)(1 << (bVar2 & 0x1f));
                puVar12[uVar15] =
                     (puVar12[uVar15] & uVar14) >> (bVar10 & 0x3f) |
                     puVar12[uVar15] << (bVar10 & 0x3f) & uVar14;
                uVar15 = uVar15 + 1;
              } while (uVar13 != uVar15);
            }
          }
          else if (iVar6 != 0x1f) {
            puVar1 = puVar12 + (int)uVar13;
            bVar10 = (byte)(iVar8 + -6);
            uVar13 = 1 << (bVar10 & 0x1f);
            iVar6 = 2 << (bVar10 & 0x1f);
            uVar14 = 1;
            if (1 < (int)uVar13) {
              uVar14 = (ulong)uVar13;
            }
            puVar16 = puVar12 + (int)uVar13;
            do {
              if (iVar8 + -6 != 0x1f) {
                uVar15 = 0;
                do {
                  uVar3 = puVar12[uVar15];
                  puVar12[uVar15] = puVar16[uVar15];
                  puVar16[uVar15] = uVar3;
                  uVar15 = uVar15 + 1;
                } while (uVar14 != uVar15);
              }
              puVar12 = puVar12 + iVar6;
              puVar16 = puVar16 + iVar6;
            } while (puVar12 < puVar1);
          }
          pMan->uPhase = pMan->uPhase ^ 1 << (bVar2 & 0x1f);
        }
      }
      local_78[1] = Abc_TtScc(pMan->pTruth,pMan->nVars);
      if ((mode != 0) || (local_78[1] <= local_c8[1])) {
        Abc_TgCalcScc(pMan,local_78 + 2,1);
        if (0 < mode) {
          local_78[0] = Abc_TgPermCostScc(pMan,local_78 + 2);
        }
        if (0 < (int)uVar11) {
          uVar14 = 0;
          do {
            if (__src[uVar14] != __dest[uVar14]) {
              if (__src[uVar14] < __dest[uVar14]) {
                memcpy(__dest,__src,(long)(int)uVar11 << 2);
                p->nSize = 0;
              }
              break;
            }
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
          if (0 < (int)uVar11) {
            uVar14 = 0;
            do {
              if (__src[uVar14] != __dest[uVar14]) goto LAB_00501e84;
              uVar14 = uVar14 + 1;
            } while (uVar11 != uVar14);
          }
        }
        Vec_IntPush(p,uVar17 >> 1 ^ uVar17);
      }
      goto LAB_00501e84;
    }
    for (bVar5 = pMan->pFGrps[(long)(int)uVar7 + -1]; -1 < (char)bVar5; bVar5 = pMan->symLink[bVar5]
        ) {
      if (pMan->symPhase[bVar5] != '\0') {
        iVar6 = pMan->nVars + -6;
        uVar11 = 1 << ((byte)iVar6 & 0x1f);
        bVar2 = pMan->pPermTRev[bVar5];
        iVar8 = (int)(char)bVar2;
        puVar12 = pMan->pTruth;
        if (pMan->nVars < 7) {
          bVar10 = (byte)(1 << (bVar2 & 0x1f));
          *puVar12 = (s_Truths6[iVar8] & *puVar12) >> (bVar10 & 0x3f) |
                     *puVar12 << (bVar10 & 0x3f) & s_Truths6[iVar8];
        }
        else if ((char)bVar2 < '\x06') {
          if (iVar6 != 0x1f) {
            uVar14 = s_Truths6[iVar8];
            uVar15 = 0;
            do {
              bVar10 = (byte)(1 << (bVar2 & 0x1f));
              puVar12[uVar15] =
                   (puVar12[uVar15] & uVar14) >> (bVar10 & 0x3f) |
                   puVar12[uVar15] << (bVar10 & 0x3f) & uVar14;
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
        }
        else if (iVar6 != 0x1f) {
          puVar1 = puVar12 + (int)uVar11;
          bVar10 = (byte)(iVar8 + -6);
          uVar11 = 1 << (bVar10 & 0x1f);
          iVar6 = 2 << (bVar10 & 0x1f);
          uVar14 = 1;
          if (1 < (int)uVar11) {
            uVar14 = (ulong)uVar11;
          }
          puVar16 = puVar12 + (int)uVar11;
          do {
            if (iVar8 + -6 != 0x1f) {
              uVar15 = 0;
              do {
                uVar3 = puVar12[uVar15];
                puVar12[uVar15] = puVar16[uVar15];
                puVar16[uVar15] = uVar3;
                uVar15 = uVar15 + 1;
              } while (uVar14 != uVar15);
            }
            puVar12 = puVar12 + iVar6;
            puVar16 = puVar16 + iVar6;
          } while (puVar12 < puVar1);
        }
        pMan->uPhase = pMan->uPhase ^ 1 << (bVar2 & 0x1f);
      }
    }
    uVar14 = 0;
    for (iVar6 = p->nSize; 2 < iVar6 + 1U; iVar6 = iVar6 / 2) {
      uVar14 = uVar14 + 0x100000000;
    }
    iVar6 = Abc_TgPermCostScc(pMan,local_c8 + 2);
    uVar14 = uVar7 | uVar14;
  }
  else {
    Abc_TgCalcScc(pMan,local_78 + 2,1);
    iVar6 = Abc_TgPermCostScc(pMan,local_78 + 2);
    uVar14 = 0;
  }
  AVar18.cPerm = iVar6;
  AVar18.cNeg = (int)uVar14;
  AVar18.cPhase = (int)(uVar14 >> 0x20);
  return AVar18;
}

Assistant:

static Abc_SccCost_t Abc_TgRecordPhase(Abc_TgMan_t * pMan, int mode)
{
    Vec_Int_t * vPhase = pMan->vPhase;
    int i, j, n = pMan->pGroup->nGVars;
    int nStart = mode == 0 ? 1 : 0;
    int nCoefs = pMan->nGVars + 2 - nStart;
    int pScc[18], pMinScc[18];
    Abc_SccCost_t ret;

    if (pMan->fPhased)
    {
        ret.cNeg = 0;
        ret.cPhase = 0;
        Abc_TgCalcScc(pMan, pScc + 2, 1);
        ret.cPerm = Abc_TgPermCostScc(pMan, pScc + 2);
        return ret;
    }

    Abc_TgReorderFGrps(pMan);
    pMinScc[1] = Abc_TtScc(pMan->pTruth, pMan->nVars);
    Abc_TgCalcScc(pMan, pMinScc + 2, 1);
    pMinScc[0] = mode == 0 ? 0 : Abc_TgPermCostScc(pMan, pMinScc + 2);
    Vec_IntPush(vPhase, 0);
    for (i = 0; (j = grayFlip(i)) < n; i++)
    {
        Abc_TgFlipSymGroupByVar(pMan, pMan->pFGrps[j]);
        pScc[1] = Abc_TtScc(pMan->pTruth, pMan->nVars);
        if (mode == 0 && pScc[1] > pMinScc[1]) continue;
        Abc_TgCalcScc(pMan, pScc + 2, 1);
        if (mode > 0)
            pScc[0] = Abc_TgPermCostScc(pMan, pScc + 2);
        if (Abc_TgCompareCoef(pScc + nStart, pMinScc + nStart, nCoefs) < 0)
        {
            memcpy(pMinScc + nStart, pScc + nStart, nCoefs * sizeof(int));
            Vec_IntClear(vPhase);
        }
        if (Abc_TgCompareCoef(pScc + nStart, pMinScc + nStart, nCoefs) == 0)
            Vec_IntPush(vPhase, grayCode(i+1));
    }
    Abc_TgFlipSymGroupByVar(pMan, pMan->pFGrps[n - 1]);

    ret.cNeg = n;
    ret.cPhase = ilog2(Vec_IntSize(vPhase));
    ret.cPerm = Abc_TgPermCostScc(pMan, pMinScc + 2);
    return ret;
}